

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O3

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromString(char *source)

{
  IOTHUB_MESSAGE_HANDLE_DATA *handleData;
  STRING_HANDLE pSVar1;
  MAP_HANDLE pMVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (source == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (IOTHUB_MESSAGE_HANDLE)0x0;
    }
    pcVar5 = "Invalid argument - source is NULL";
    iVar4 = 0x126;
LAB_00126043:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
              ,"IoTHubMessage_CreateFromString",iVar4,1,pcVar5);
    return (IOTHUB_MESSAGE_HANDLE)0x0;
  }
  handleData = (IOTHUB_MESSAGE_HANDLE_DATA *)calloc(1,0x90);
  if (handleData == (IOTHUB_MESSAGE_HANDLE_DATA *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (IOTHUB_MESSAGE_HANDLE)0x0;
    }
    pcVar5 = "malloc failed";
    iVar4 = 0x12e;
    goto LAB_00126043;
  }
  handleData->contentType = IOTHUBMESSAGE_STRING;
  pSVar1 = STRING_construct(source);
  (handleData->value).string = pSVar1;
  if (pSVar1 == (STRING_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00126084;
    pcVar5 = "STRING_construct failed";
    iVar4 = 0x138;
  }
  else {
    pMVar2 = Map_Create(ValidateAsciiCharactersFilter);
    handleData->properties = pMVar2;
    if (pMVar2 != (MAP_HANDLE)0x0) {
      return handleData;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00126084;
    pcVar5 = "Map_Create for properties failed";
    iVar4 = 0x13e;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
            ,"IoTHubMessage_CreateFromString",iVar4,1,pcVar5);
LAB_00126084:
  DestroyMessageData(handleData);
  return (IOTHUB_MESSAGE_HANDLE)0x0;
}

Assistant:

IOTHUB_MESSAGE_HANDLE IoTHubMessage_CreateFromString(const char* source)
{
    IOTHUB_MESSAGE_HANDLE_DATA* result;
    if (source == NULL)
    {
        LogError("Invalid argument - source is NULL");
        result = NULL;
    }
    else
    {
        result = (IOTHUB_MESSAGE_HANDLE_DATA*)malloc(sizeof(IOTHUB_MESSAGE_HANDLE_DATA));
        if (result == NULL)
        {
            LogError("malloc failed");
            /*let it go through*/
        }
        else
        {
            memset(result, 0, sizeof(*result));
            result->contentType = IOTHUBMESSAGE_STRING;

            if ((result->value.string = STRING_construct(source)) == NULL)
            {
                LogError("STRING_construct failed");
                DestroyMessageData(result);
                result = NULL;
            }
            else if ((result->properties = Map_Create(ValidateAsciiCharactersFilter)) == NULL)
            {
                LogError("Map_Create for properties failed");
                DestroyMessageData(result);
                result = NULL;
            }
        }
    }
    return result;
}